

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O0

ON_ScaleValue *
ON_ScaleValue::Create
          (ON_ScaleValue *__return_storage_ptr__,ON_LengthValue *left_side_length,
          ON_LengthValue *right_side_length,ScaleStringFormat string_format_preference)

{
  bool bVar1;
  ON_UnitSystem *pOVar2;
  ON_UnitSystem *pOVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  double dVar6;
  double local_70;
  double y;
  double x;
  double right_to_left_scale;
  double left_to_right_scale;
  double right_length;
  double left_length;
  LengthUnitSystem right_length_unit_system;
  LengthUnitSystem left_length_unit_system;
  undefined1 local_22;
  ScaleStringFormat local_21;
  ON_LengthValue *pOStack_20;
  ScaleStringFormat string_format_preference_local;
  ON_LengthValue *right_side_length_local;
  ON_LengthValue *left_side_length_local;
  ON_ScaleValue *scale_value;
  
  local_22 = 0;
  local_21 = string_format_preference;
  pOStack_20 = right_side_length;
  right_side_length_local = left_side_length;
  left_side_length_local = (ON_LengthValue *)__return_storage_ptr__;
  ON_ScaleValue(__return_storage_ptr__,&Unset);
  ON_LengthValue::operator=(&__return_storage_ptr__->m_left_length,right_side_length_local);
  ON_LengthValue::operator=(&__return_storage_ptr__->m_right_length,pOStack_20);
  __return_storage_ptr__->m_string_format_preference = local_21;
  bVar1 = ON_LengthValue::IsUnset(&__return_storage_ptr__->m_left_length);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  bVar1 = ON_LengthValue::IsUnset(&__return_storage_ptr__->m_right_length);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  pOVar2 = ON_LengthValue::LengthUnitSystem(&__return_storage_ptr__->m_left_length);
  left_length._7_1_ = ON_UnitSystem::UnitSystem(pOVar2);
  pOVar2 = ON_LengthValue::LengthUnitSystem(&__return_storage_ptr__->m_right_length);
  left_length._6_1_ = ON_UnitSystem::UnitSystem(pOVar2);
  right_length = ON_LengthValue::Length(&__return_storage_ptr__->m_left_length,left_length._7_1_);
  left_to_right_scale =
       ON_LengthValue::Length(&__return_storage_ptr__->m_right_length,left_length._6_1_);
  if (right_length <= 0.0 || left_to_right_scale <= 0.0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
               ,0x5c5,"","Invalid input");
    return __return_storage_ptr__;
  }
  pOVar2 = ON_LengthValue::LengthUnitSystem(&__return_storage_ptr__->m_left_length);
  pOVar3 = ON_LengthValue::LengthUnitSystem(&__return_storage_ptr__->m_right_length);
  right_to_left_scale = ON::UnitScale(pOVar2,pOVar3);
  pOVar2 = ON_LengthValue::LengthUnitSystem(&__return_storage_ptr__->m_right_length);
  pOVar3 = ON_LengthValue::LengthUnitSystem(&__return_storage_ptr__->m_left_length);
  x = ON::UnitScale(pOVar2,pOVar3);
  bVar1 = false;
  if ((0.0 < right_to_left_scale) && (bVar1 = false, 0.0 < x)) {
    dVar6 = ON_InternalDefuzz(1e-14,right_to_left_scale * x);
    bVar1 = dVar6 == 1.0;
  }
  if (!bVar1) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
               ,0x5e6,"","Invalid input");
    ON_InternalDefuzz(1e-14,right_to_left_scale * x);
    return __return_storage_ptr__;
  }
  y = right_length;
  local_70 = left_to_right_scale;
  if (right_to_left_scale <= x) {
    if (right_to_left_scale < x) {
      local_70 = x * left_to_right_scale;
    }
  }
  else {
    y = right_to_left_scale * right_length;
  }
  if (y <= 0.0 || local_70 <= 0.0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
               ,0x5f5,"","Invalid input");
    return __return_storage_ptr__;
  }
  bVar1 = ON_Internal_SimplifyRatio(&y,&local_70);
  if (!bVar1) {
    local_21 = EquationFormat;
  }
  dVar6 = ON_InternalQuotient(0.0,y,local_70);
  __return_storage_ptr__->m_left_to_right_scale = dVar6;
  dVar6 = ON_InternalQuotient(0.0,local_70,y);
  __return_storage_ptr__->m_right_to_left_scale = dVar6;
  if (2.0 <= __return_storage_ptr__->m_left_to_right_scale) {
    dVar6 = floor(__return_storage_ptr__->m_left_to_right_scale);
    if ((dVar6 == __return_storage_ptr__->m_left_to_right_scale) &&
       (!NAN(dVar6) && !NAN(__return_storage_ptr__->m_left_to_right_scale))) {
      __return_storage_ptr__->m_right_to_left_scale =
           1.0 / __return_storage_ptr__->m_left_to_right_scale;
      goto LAB_008610ca;
    }
  }
  if (2.0 <= __return_storage_ptr__->m_right_to_left_scale) {
    dVar6 = floor(__return_storage_ptr__->m_right_to_left_scale);
    if ((dVar6 == __return_storage_ptr__->m_right_to_left_scale) &&
       (!NAN(dVar6) && !NAN(__return_storage_ptr__->m_right_to_left_scale))) {
      __return_storage_ptr__->m_left_to_right_scale =
           1.0 / __return_storage_ptr__->m_right_to_left_scale;
    }
  }
LAB_008610ca:
  if (local_21 == RatioFormat) {
    ON_wString::Format(&__return_storage_ptr__->m_scale_as_string,L"%.17g:%.17g",y,local_70);
  }
  else if ((local_21 == EquationFormat) || (local_21 != FractionFormat)) {
    pwVar4 = ON_LengthValue::LengthAsStringPointer(&__return_storage_ptr__->m_left_length);
    pwVar5 = ON_LengthValue::LengthAsStringPointer(&__return_storage_ptr__->m_right_length);
    ON_wString::Format(&__return_storage_ptr__->m_scale_as_string,L"%ls = %ls",pwVar4,pwVar5);
  }
  else {
    ON_wString::Format(&__return_storage_ptr__->m_scale_as_string,L"%.17g/%.17g",y,local_70);
  }
  __return_storage_ptr__->m_string_format_preference = local_21;
  return __return_storage_ptr__;
}

Assistant:

ON_ScaleValue ON_ScaleValue::Create(
  const class ON_LengthValue& left_side_length,
  const class ON_LengthValue& right_side_length,
  ON_ScaleValue::ScaleStringFormat string_format_preference
)
{
  ON_ScaleValue scale_value = ON_ScaleValue::Unset;

  scale_value.m_left_length = left_side_length;
  scale_value.m_right_length = right_side_length;
  scale_value.m_string_format_preference = string_format_preference;

  if (scale_value.m_left_length.IsUnset() || scale_value.m_right_length.IsUnset())
    return scale_value;

  ON::LengthUnitSystem left_length_unit_system = scale_value.m_left_length.LengthUnitSystem().UnitSystem();
  ON::LengthUnitSystem right_length_unit_system = scale_value.m_right_length.LengthUnitSystem().UnitSystem();
  const double left_length = scale_value.m_left_length.Length(left_length_unit_system);
  const double right_length = scale_value.m_right_length.Length(right_length_unit_system);
  if (false == (left_length > 0.0 && right_length > 0.0))
  {
    // one or both of left_length and right_length is a NAN or negative
    ON_ERROR("Invalid input");
    return scale_value;
  }

  // Dale Lear http://mcneel.myjetbrains.com/youtrack/issue/RH-34709
  // Turns out that stripping unit system information when one side is None
  // was a bad idea. After using ON_ScaleValue in the ON_DimStyle
  // class, preserving the unit systems works better when one
  // is None.
  ////if (ON::LengthUnitSystem::None == left_length_unit_system
  ////  && ON::LengthUnitSystem::None != right_length_unit_system
  ////  )
  ////{
  ////  // remove units from right side 
  ////  scale_value.m_right_length = scale_value.m_right_length.RemoveUnitSystem();
  ////  right_length_unit_system = ON::LengthUnitSystem::None;
  ////}

  ////if (ON::LengthUnitSystem::None != left_length_unit_system
  ////  && ON::LengthUnitSystem::None == right_length_unit_system
  ////  )
  ////{
  ////  // remove units from left side 
  ////  scale_value.m_left_length = scale_value.m_left_length.RemoveUnitSystem();
  ////  left_length_unit_system = ON::LengthUnitSystem::None;
  ////}

  const double left_to_right_scale = ON::UnitScale(scale_value.m_left_length.LengthUnitSystem(), scale_value.m_right_length.LengthUnitSystem());
  const double right_to_left_scale = ON::UnitScale(scale_value.m_right_length.LengthUnitSystem(), scale_value.m_left_length.LengthUnitSystem());

  if (false == (left_to_right_scale > 0.0 && right_to_left_scale > 0.0 && 1.0 == ON_InternalDefuzz(1.0e-14,left_to_right_scale*right_to_left_scale)) )
  {
    // one or both of left_to_right_scale and right_to_left_scale is a NAN or not set correctly
    ON_ERROR("Invalid input");
    ON_InternalDefuzz(1.0e-14, left_to_right_scale*right_to_left_scale);
    return scale_value;
  }
  
  double x = left_length;
  double y = right_length;
  if (left_to_right_scale > right_to_left_scale)
    x *= left_to_right_scale;
  else if ( right_to_left_scale > left_to_right_scale)
    y *= right_to_left_scale;

  if (false == (x > 0.0 && y > 0.0))
  {
    // one or both of x and y is a NAN or not set correctly
    ON_ERROR("Invalid input");
    return scale_value;
  }

  if (!ON_Internal_SimplifyRatio(x, y))
    string_format_preference = ON_ScaleValue::ScaleStringFormat::EquationFormat;

  scale_value.m_left_to_right_scale = ON_InternalQuotient(0.0,x,y);
  scale_value.m_right_to_left_scale = ON_InternalQuotient(0.0,y,x);

  if (scale_value.m_left_to_right_scale >= 2.0 && floor(scale_value.m_left_to_right_scale) == scale_value.m_left_to_right_scale)
  {
    scale_value.m_right_to_left_scale = 1.0 / scale_value.m_left_to_right_scale;
  }
  else if (scale_value.m_right_to_left_scale >= 2.0 && floor(scale_value.m_right_to_left_scale) == scale_value.m_right_to_left_scale)
  {
    scale_value.m_left_to_right_scale = 1.0 / scale_value.m_right_to_left_scale;
  }

  switch (string_format_preference)
  {
  case ON_ScaleValue::ScaleStringFormat::RatioFormat:
    // Do NOT dumb down the %.17g in the format string.
    // If you don't like the format, then make your own string and call
    // ON_ScaleValue::CreateFromString(). It is critical that 
    // the values in the formatted string exactly match the double values.
    scale_value.m_scale_as_string.Format(L"%.17g:%.17g", x, y);
    break;
  case ON_ScaleValue::ScaleStringFormat::FractionFormat:
    // Do NOT dumb down the %.17g in the format string.
    // If you don't like the format, then make your own string and call
    // ON_ScaleValue::CreateFromString(). It is critical that 
    // the values in the formatted string exactly match the double values.
    scale_value.m_scale_as_string.Format(L"%.17g/%.17g", x, y);
    break;
  case ON_ScaleValue::ScaleStringFormat::EquationFormat:
    // no break here
  default:
    scale_value.m_scale_as_string.Format(L"%ls = %ls",
      scale_value.m_left_length.LengthAsStringPointer(), 
      scale_value.m_right_length.LengthAsStringPointer()
    );
    break;
  }

  scale_value.m_string_format_preference = string_format_preference;


  return scale_value;
}